

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BoyerMooreFind.h
# Opt level: O0

size_t __thiscall
axl::sl::
BoyerMooreFindBase<axl::sl::BoyerMooreDetailsBase<char,axl::sl::BoyerMooreSkipTablesBase<char>,false,256ul>>
::
findImpl<axl::sl::BoyerMooreIncrementalAccessorBase<char,false,axl::sl::BoyerMooreStateBase<char>>>
          (BoyerMooreFindBase<axl::sl::BoyerMooreDetailsBase<char,_axl::sl::BoyerMooreSkipTablesBase<char>,_false,_256UL>_>
           *this,BoyerMooreIncrementalAccessorBase<char,_false,_axl::sl::BoyerMooreStateBase<char>_>
                 *accessor,size_t i0,size_t length)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  ulong in_RCX;
  long in_RDX;
  ArrayRef<char,_axl::sl::ArrayDetails<char>_> *in_RDI;
  C c;
  intptr_t j;
  size_t i;
  size_t last;
  undefined4 in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb8;
  char in_stack_ffffffffffffffbf;
  BoyerMooreSkipTablesBase<char> *this_00;
  BoyerMooreSkipTablesBase<char> *this_01;
  
  sVar2 = ArrayRef<char,_axl::sl::ArrayDetails<char>_>::getCount(in_RDI);
  sVar4 = (long)&(((BoyerMooreSkipTablesBase<char> *)(sVar2 - 1))->m_badSkipTable).
                 super_BoyerMooreSkipTableRoot.m_table.
                 super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>.m_p + in_RDX;
  this_00 = (BoyerMooreSkipTablesBase<char> *)(sVar2 - 1);
  do {
    this_01 = this_00;
    if (in_RCX <= sVar4) {
      return sVar4 - (long)this_00;
    }
    while( true ) {
      in_stack_ffffffffffffffbf =
           BoyerMooreIncrementalAccessorBase<char,_false,_axl::sl::BoyerMooreStateBase<char>_>::
           operator[]((BoyerMooreIncrementalAccessorBase<char,_false,_axl::sl::BoyerMooreStateBase<char>_>
                       *)this_00,CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
      iVar1 = (int)in_stack_ffffffffffffffbf;
      pcVar3 = Array<char,_axl::sl::ArrayDetails<char>_>::operator[]
                         ((Array<char,_axl::sl::ArrayDetails<char>_> *)in_RDI,
                          CONCAT44(iVar1,in_stack_ffffffffffffffa8));
      if (iVar1 != *pcVar3) break;
      if (this_00 == (BoyerMooreSkipTablesBase<char> *)0x0) {
        return sVar4;
      }
      sVar4 = sVar4 - 1;
      this_00 = (BoyerMooreSkipTablesBase<char> *)
                ((long)&this_00[-1].m_goodSkipTable.super_BoyerMooreSkipTableRoot.m_table.
                        super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>.m_count
                + 7);
    }
    sVar2 = BoyerMooreSkipTablesBase<char>::getSkip(this_01,(char)(sVar4 >> 0x38),(size_t)this_00);
    sVar4 = sVar2 + sVar4;
    this_00 = this_01;
  } while( true );
}

Assistant:

size_t
	findImpl(
		const Accessor& accessor,
		size_t i0,
		size_t length
	) const {
		size_t last = m_pattern.getCount() - 1;
		size_t i = i0 + last;
		while (i < length) {
			intptr_t j = last;
			C c;
			for (;;) {
				c = accessor[i];
				if (c != m_pattern[j])
					break;

				if (j == 0)
					return i;

				i--;
				j--;
			}

			i += m_skipTables.getSkip(c, j);
		}

		return i - last; // prospective start of match
	}